

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_avx2.c
# Opt level: O3

void aom_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  short *psVar37;
  ulong uVar38;
  ushort uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  bool bVar43;
  long lVar44;
  uint *puVar45;
  long lVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint local_40;
  uint local_3c [3];
  
  lVar46 = 0;
  puVar45 = local_3c;
  bVar36 = true;
  do {
    bVar43 = bVar36;
    *puVar45 = ((dequant_ptr[lVar46] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar46] * 0x20) - 1;
    lVar46 = 1;
    puVar45 = &local_40;
    bVar36 = false;
  } while (bVar43);
  auVar47._4_4_ = local_40;
  auVar47._0_4_ = local_40;
  auVar47._8_4_ = local_40;
  auVar47._12_4_ = local_40;
  auVar47._16_4_ = local_40;
  auVar47._20_4_ = local_40;
  auVar47._24_4_ = local_40;
  auVar47._28_4_ = local_40;
  auVar55 = vpblendd_avx2(auVar47,ZEXT432(local_3c[0]),1);
  auVar59 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar57 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
  auVar58 = vpaddw_avx2(auVar59,auVar57);
  auVar59 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar57 = vpabsw_avx2(auVar59);
  auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar50 = vpunpcklwd_avx2(auVar57,auVar53);
  auVar51 = vpunpckhwd_avx2(auVar57,auVar53);
  auVar50 = vpslld_avx2(auVar50,5);
  auVar50 = vpcmpgtd_avx2(auVar50,auVar55);
  auVar51 = vpslld_avx2(auVar51,5);
  auVar51 = vpcmpgtd_avx2(auVar51,auVar47);
  auVar50 = vpackssdw_avx2(auVar50,auVar51);
  auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar33 = (auVar50 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar50 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar50 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar50 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar50 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar50 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar50 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar50 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar50 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = (auVar50 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = (auVar50 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar50 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = SUB321(auVar50 >> 0x7f,0) != '\0';
  bVar18 = (auVar50 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar50 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar50 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar50 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = (auVar50 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = (auVar50 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar50 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = SUB321(auVar50 >> 0xbf,0) != '\0';
  bVar10 = (auVar50 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar50 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar50 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar50 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = (auVar50 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar5 = (auVar50 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar43 = (auVar50 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar36 = auVar50[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar33 || bVar34) || bVar32) || bVar31) || bVar30) || bVar29) ||
                              bVar28) || bVar27) || bVar26) || bVar25) || bVar24) || bVar23) ||
                        bVar22) || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) ||
                 bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8)
         || bVar7) || bVar6) || bVar5) || bVar43) || bVar36) {
    auVar50 = vpermq_avx2(auVar50,0xd8);
    auVar51 = vpand_avx2(auVar50,*(undefined1 (*) [32])iscan);
  }
  bVar36 = ((((((((((((((((((((((((((((((bVar33 || bVar34) || bVar32) || bVar31) || bVar30) ||
                                    bVar29) || bVar28) || bVar27) || bVar26) || bVar25) || bVar24)
                              || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                        bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) ||
                 bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar5) || bVar43) || bVar36;
  auVar50 = vpcmpgtw_avx2(auVar57,auVar58);
  bVar34 = (auVar50 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar35 = (auVar50 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar33 = (auVar50 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar32 = (auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar31 = (auVar50 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar30 = (auVar50 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar29 = (auVar50 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar28 = (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar27 = (auVar50 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar26 = (auVar50 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar25 = (auVar50 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar24 = (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar23 = (auVar50 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar22 = (auVar50 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar21 = (auVar50 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar20 = SUB321(auVar50 >> 0x7f,0) == '\0';
  bVar19 = (auVar50 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar18 = (auVar50 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar17 = (auVar50 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar16 = (auVar50 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar15 = (auVar50 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar14 = (auVar50 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar13 = (auVar50 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar12 = SUB321(auVar50 >> 0xbf,0) == '\0';
  bVar11 = (auVar50 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar10 = (auVar50 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar9 = (auVar50 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar8 = (auVar50 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar7 = (auVar50 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar6 = (auVar50 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar5 = (auVar50 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar43 = -1 < auVar50[0x1f];
  auVar56 = ZEXT1632(*(undefined1 (*) [16])round_ptr);
  auVar55 = ZEXT1632(*(undefined1 (*) [16])quant_ptr);
  auVar52 = ZEXT1632(*(undefined1 (*) [16])quant_shift_ptr);
  auVar60 = ZEXT1632(*(undefined1 (*) [16])dequant_ptr);
  if (((((((((((((((((((((((((((((((bVar34 && bVar35) && bVar33) && bVar32) && bVar31) && bVar30) &&
                              bVar29) && bVar28) && bVar27) && bVar26) && bVar25) && bVar24) &&
                        bVar23) && bVar22) && bVar21) && bVar20) && bVar19) && bVar18) && bVar17) &&
                 bVar16) && bVar15) && bVar14) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9)
         && bVar8) && bVar7) && bVar6) && bVar5) && bVar43) {
    auVar4 = vpermq_avx2(auVar56,0x55);
    auVar3 = vpermq_avx2(auVar55,0x55);
    auVar56 = vpermq_avx2(auVar52,0x55);
    auVar52 = vpermq_avx2(auVar60,0x55);
    auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar57 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar48 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar3 = vpermq_avx2(auVar50,0xd8);
    auVar3 = vpand_avx2(auVar3,*(undefined1 (*) [32])iscan);
    auVar3 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar3);
    auVar48 = ZEXT3264(auVar3);
    auVar3 = vpermq_avx2(auVar56,0x54);
    auVar57 = vpaddsw_avx2(auVar3,auVar57);
    auVar3 = vpermq_avx2(auVar55,0x54);
    auVar3 = vpmulhw_avx2(auVar3,auVar57);
    auVar57 = vpaddw_avx2(auVar3,auVar57);
    auVar3 = vpermq_avx2(auVar52,0x54);
    auVar57 = vpmulhw_avx2(auVar3,auVar57);
    auVar4 = vpermq_avx2(auVar56,0x55);
    auVar3 = vpermq_avx2(auVar55,0x55);
    auVar56 = vpermq_avx2(auVar52,0x55);
    auVar57 = vpsignw_avx2(auVar57,auVar59);
    auVar59 = vpand_avx2(auVar50,auVar57);
    auVar57 = vpsraw_avx2(auVar59,0xf);
    auVar50 = vpunpcklwd_avx2(auVar59,auVar57);
    auVar57 = vpunpckhwd_avx2(auVar59,auVar57);
    auVar55 = vpermq_avx2(auVar60,0x54);
    auVar59 = vpmullw_avx2(auVar55,auVar59);
    auVar52 = vpermq_avx2(auVar60,0x55);
    auVar60 = vpsraw_avx2(auVar59,0xf);
    auVar55 = vpunpcklwd_avx2(auVar59,auVar60);
    auVar59 = vpunpckhwd_avx2(auVar59,auVar60);
  }
  bVar43 = ((((((((((((((((((((((((((((((!bVar34 || !bVar35) || !bVar33) || !bVar32) || !bVar31) ||
                                    !bVar30) || !bVar29) || !bVar28) || !bVar27) || !bVar26) ||
                               !bVar25) || !bVar24) || !bVar23) || !bVar22) || !bVar21) || !bVar20)
                         || !bVar19) || !bVar18) || !bVar17) || !bVar16) || !bVar15) || !bVar14) ||
                   !bVar13) || !bVar12) || !bVar11) || !bVar10) || !bVar9) || !bVar8) || !bVar7) ||
            !bVar6) || !bVar5) || !bVar43;
  auVar60 = auVar48._0_32_;
  auVar51 = vpmaxsw_avx2(auVar51,auVar53);
  auVar54 = ZEXT3264(auVar51);
  *(undefined1 (*) [32])qcoeff_ptr = auVar50;
  *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar57;
  *(undefined1 (*) [32])dqcoeff_ptr = auVar55;
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar59;
  if (0x10 < n_coeffs) {
    auVar57 = vpshufd_avx2(auVar58,0xee);
    iVar42 = 0x10;
    lVar46 = 0x10;
    do {
      lVar44 = (long)iVar42;
      while( true ) {
        iVar42 = iVar42 + 0x10;
        auVar50 = vpackssdw_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar46),
                                 *(undefined1 (*) [32])(coeff_ptr + lVar46 + 8));
        auVar59 = vpabsw_avx2(auVar50);
        auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar58 = vpunpcklwd_avx2(auVar59,auVar55);
        auVar51 = vpunpckhwd_avx2(auVar59,auVar55);
        auVar58 = vpslld_avx2(auVar58,5);
        auVar58 = vpcmpgtd_avx2(auVar58,auVar47);
        auVar51 = vpslld_avx2(auVar51,5);
        auVar51 = vpcmpgtd_avx2(auVar51,auVar47);
        auVar58 = vpackssdw_avx2(auVar58,auVar51);
        if ((((((((((((((((((((((((((((((((auVar58 >> 7 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar58 >> 0xf & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar58 >> 0x17 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar58 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar58 >> 0x27 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar58 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar58 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar58 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar58 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar58 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar58 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar58 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar58 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar58 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar58 >> 0x7f,0) == '\0') &&
                          (auVar58 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar58 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar58 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar58 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar58 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar58 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar58 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar58 >> 0xbf,0) == '\0') &&
                  (auVar58 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar58 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar58 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar58 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar58 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar58 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar58 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            -1 < auVar58[0x1f]) {
          auVar58 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        }
        else {
          auVar58 = vpermq_avx2(auVar58,0xd8);
          auVar58 = vpand_avx2(auVar58,*(undefined1 (*) [32])(iscan + lVar46));
          bVar36 = true;
        }
        auVar51 = vpmaxsw_avx2(auVar58,auVar54._0_32_);
        auVar54 = ZEXT3264(auVar51);
        auVar58 = vpcmpgtw_avx2(auVar59,auVar57);
        if ((((((((((((((((((((((((((((((((auVar58 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar58 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar58 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar58 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar58 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar58 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar58 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar58 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar58 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar58 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar58 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar58 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar58 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar58 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar58 >> 0x7f,0) != '\0') ||
                          (auVar58 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar58 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar58 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar58 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar58 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar58 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar58 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar58 >> 0xbf,0) != '\0') ||
                  (auVar58 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar58 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar58 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar58 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar58 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar58 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar58 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar58[0x1f] < '\0') break;
        auVar60 = vpmaxsw_avx2(auVar55,auVar48._0_32_);
        auVar48 = ZEXT3264(auVar60);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar46 + 8) = auVar55;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar46) = auVar55;
        lVar44 = lVar44 + 0x10;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar46 + 8) = auVar55;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar46) = auVar55;
        lVar46 = lVar44;
        if (n_coeffs <= lVar44) goto LAB_0036f798;
      }
      auVar55 = vpermq_avx2(auVar58,0xd8);
      auVar55 = vpand_avx2(auVar55,*(undefined1 (*) [32])(iscan + lVar46));
      auVar60 = vpmaxsw_avx2(auVar55,auVar48._0_32_);
      auVar48 = ZEXT3264(auVar60);
      auVar59 = vpaddsw_avx2(auVar59,auVar4);
      auVar55 = vpmulhw_avx2(auVar59,auVar3);
      auVar59 = vpaddw_avx2(auVar55,auVar59);
      auVar59 = vpmulhw_avx2(auVar59,auVar56);
      auVar59 = vpsignw_avx2(auVar59,auVar50);
      auVar59 = vpand_avx2(auVar58,auVar59);
      auVar50 = vpsraw_avx2(auVar59,0xf);
      auVar58 = vpunpcklwd_avx2(auVar59,auVar50);
      auVar50 = vpunpckhwd_avx2(auVar59,auVar50);
      *(undefined1 (*) [32])(qcoeff_ptr + lVar46) = auVar58;
      *(undefined1 (*) [32])(qcoeff_ptr + lVar46 + 8) = auVar50;
      auVar59 = vpmullw_avx2(auVar59,auVar52);
      auVar58 = vpsraw_avx2(auVar59,0xf);
      auVar50 = vpunpcklwd_avx2(auVar59,auVar58);
      auVar59 = vpunpckhwd_avx2(auVar59,auVar58);
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar46) = auVar50;
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar46 + 8) = auVar59;
      lVar46 = (long)iVar42;
      bVar43 = true;
    } while (lVar46 < n_coeffs);
  }
LAB_0036f798:
  if (bVar36) {
    auVar2 = vpmaxsw_avx(auVar51._0_16_,auVar51._16_16_);
    auVar49 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar49,auVar2);
    auVar49 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar49,auVar2);
    auVar49 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar49);
    iVar42 = vpextrw_avx(auVar2,0);
    uVar41 = iVar42 + 1;
  }
  else {
    uVar41 = 0;
  }
  if (bVar43) {
    auVar2 = vpmaxsw_avx(auVar60._0_16_,auVar60._16_16_);
    auVar49 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar49,auVar2);
    auVar49 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar49,auVar2);
    auVar49 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar49);
    uVar40 = vpextrw_avx(auVar2,0);
  }
  else {
    uVar40 = 0xffffffff;
  }
  if ((int)uVar41 <= (int)uVar40) {
    iVar42 = uVar40 + 1;
    psVar37 = scan + uVar40;
    do {
      sVar1 = *psVar37;
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      iVar42 = iVar42 + -1;
      psVar37 = psVar37 + -1;
    } while ((int)uVar41 < iVar42);
  }
  iVar42 = uVar41 + 1;
  uVar38 = (ulong)uVar41;
  do {
    if ((long)uVar38 < 1) {
      uVar39 = 0;
      break;
    }
    lVar46 = uVar38 - 1;
    uVar38 = uVar38 - 1;
    iVar42 = iVar42 + -1;
    uVar39 = (ushort)iVar42;
  } while (qcoeff_ptr[scan[lVar46]] == 0);
  *eob_ptr = uVar39;
  uVar40 = 0xffffffff;
  if (uVar41 != 0) {
    uVar38 = 0;
    do {
      if (qcoeff_ptr[scan[uVar38]] != 0) {
        uVar40 = (uint)uVar38;
        break;
      }
      uVar38 = uVar38 + 1;
    } while (uVar41 != uVar38);
  }
  if ((uVar39 != 0) && (uVar40 == uVar39 - 1)) {
    sVar1 = scan[uVar40];
    if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
       (uVar41 = coeff_ptr[sVar1] >> 0x1f, uVar38 = (ulong)((uint)(sVar1 != 0) * 2),
       (int)((coeff_ptr[sVar1] << 5 ^ uVar41) - uVar41) <
       *(short *)((long)zbin_ptr + uVar38) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar38) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff, qcoeff;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                     dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff = load_coefficients_avx2(coeff_ptr);
  qcoeff = _mm256_abs_epi16(coeff);
  update_mask0_avx2(&qcoeff, threshold, iscan, &is_found0, &mask0);
  __m256i temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
  update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    // Reinsert signs
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    // Mask out zbin threshold coeffs
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff = load_coefficients_avx2(coeff_ptr + index);
    qcoeff = _mm256_abs_epi16(coeff);
    update_mask0_avx2(&qcoeff, threshold, iscan + index, &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
    cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
    update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr + index);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff0 = qcoeff_ptr[rc];
    if (qcoeff0) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff0 = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff0);
      const int abs_coeff = (coeff0 ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}